

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCullDistanceTests.cpp
# Opt level: O3

string * __thiscall
glcts::CullDistance::NegativeTest::getTestDescription_abi_cxx11_
          (string *__return_storage_ptr__,NegativeTest *this,int n_test_iteration,
          bool should_redeclare_output_variables,bool use_dynamic_index_based_writes)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  stringstream stream;
  stringstream local_1b0 [16];
  undefined1 local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Test iteration [",0x10);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,n_test_iteration);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"] which uses a vertex shader that:\n\n",0x24);
  pcVar3 = "* does not redeclare gl_ClipDistance and gl_CullDistance arrays\n";
  if (should_redeclare_output_variables) {
    pcVar3 = "* redeclares gl_ClipDistance and gl_CullDistance arrays\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,pcVar3,(ulong)!should_redeclare_output_variables * 8 + 0x38);
  pcVar3 = "* uses static writes\n";
  if (use_dynamic_index_based_writes) {
    pcVar3 = "* uses dynamic index-based writes\n";
  }
  lVar2 = 0x15;
  if (use_dynamic_index_based_writes) {
    lVar2 = 0x22;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,lVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string CullDistance::NegativeTest::getTestDescription(int n_test_iteration, bool should_redeclare_output_variables,
														   bool use_dynamic_index_based_writes)
{
	std::stringstream stream;

	stream << "Test iteration [" << n_test_iteration << "] which uses a vertex shader that:\n\n"
		   << ((should_redeclare_output_variables) ?
				   "* redeclares gl_ClipDistance and gl_CullDistance arrays\n" :
				   "* does not redeclare gl_ClipDistance and gl_CullDistance arrays\n")
		   << ((use_dynamic_index_based_writes) ? "* uses dynamic index-based writes\n" : "* uses static writes\n");

	return stream.str();
}